

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

void __thiscall
kratos::ModuleInstantiationStmt::ModuleInstantiationStmt
          (ModuleInstantiationStmt *this,Generator *target,Generator *parent)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  Port *local_50;
  pointer local_48;
  Generator *local_40;
  InstantiationStmt *local_38;
  
  (this->super_Stmt).super_enable_shared_from_this<kratos::Stmt>._M_weak_this.
  super___weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Stmt).super_enable_shared_from_this<kratos::Stmt>._M_weak_this.
  super___weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Stmt).super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Stmt).super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->super_Stmt).super_IRNode.fn_name_ln.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_Stmt).super_IRNode.fn_name_ln.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->super_Stmt).super_IRNode.comment._M_dataplus._M_p =
       (pointer)&(this->super_Stmt).super_IRNode.comment.field_2;
  (this->super_Stmt).super_IRNode.comment._M_string_length = 0;
  (this->super_Stmt).super_IRNode.comment.field_2._M_local_buf[0] = '\0';
  (this->super_Stmt).super_IRNode.ast_node_type_ = StmtKind;
  (this->super_Stmt).super_IRNode.attributes_.
  super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Stmt).super_IRNode.attributes_.
  super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Stmt).super_IRNode.attributes_.
  super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Stmt).type_ = ModuleInstantiation;
  (this->super_Stmt).parent_ = (IRNode *)0x0;
  (this->super_Stmt).stmt_id_ = -1;
  p_Var1 = &(this->super_Stmt).scope_context_._M_t._M_impl.super__Rb_tree_header;
  (this->super_Stmt).scope_context_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->super_Stmt).scope_context_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_Stmt).scope_context_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_Stmt).scope_context_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_Stmt).scope_context_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_InstantiationStmt).port_mapping_._M_t._M_impl.super__Rb_tree_header;
  (this->super_InstantiationStmt).port_mapping_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->super_InstantiationStmt).port_mapping_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_InstantiationStmt).port_mapping_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->super_InstantiationStmt).port_mapping_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->super_InstantiationStmt).port_mapping_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0
  ;
  p_Var1 = &(this->super_InstantiationStmt).port_debug_._M_t._M_impl.super__Rb_tree_header;
  (this->super_InstantiationStmt).port_debug_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->super_InstantiationStmt).port_debug_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  (this->super_InstantiationStmt).port_debug_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_InstantiationStmt).port_debug_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (this->super_InstantiationStmt).port_debug_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_InstantiationStmt).connection_stmt_._M_h._M_buckets =
       &(this->super_InstantiationStmt).connection_stmt_._M_h._M_single_bucket;
  (this->super_InstantiationStmt).connection_stmt_._M_h._M_bucket_count = 1;
  (this->super_InstantiationStmt).connection_stmt_._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->super_InstantiationStmt).connection_stmt_._M_h._M_element_count = 0;
  (this->super_InstantiationStmt).connection_stmt_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_InstantiationStmt).connection_stmt_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_InstantiationStmt).connection_stmt_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002cbef8;
  (this->super_InstantiationStmt)._vptr_InstantiationStmt =
       (_func_int **)&PTR_instantiation_type_002cbf78;
  this->target_ = target;
  p_Var2 = (target->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(target->ports_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var1) {
    local_38 = &this->super_InstantiationStmt;
    local_40 = parent;
    do {
      Generator::get_port((Generator *)&stack0xffffffffffffffb0,(string *)target);
      InstantiationStmt::process_port(local_38,local_50,local_40,&target->name);
      if (local_48 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
  }
  target->has_instantiated_ = true;
  return;
}

Assistant:

ModuleInstantiationStmt::ModuleInstantiationStmt(Generator *target, Generator *parent)
    : Stmt(StatementType::ModuleInstantiation), target_(target) {
    auto const &port_names = target->get_port_names();
    for (auto const &port_name : port_names) {
        auto const &port_shared = target->get_port(port_name);
        auto *port = port_shared.get();
        process_port(port, parent, target->name);
    }
    target->has_instantiated() = true;
}